

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

Texture2D * rlGetTextureDefault(void)

{
  Texture2D *in_RDI;
  
  in_RDI->id = 0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  in_RDI->id = RLGL.State.defaultTextureId;
  in_RDI->width = 1;
  in_RDI->height = 1;
  in_RDI->mipmaps = 1;
  in_RDI->format = 7;
  return in_RDI;
}

Assistant:

Texture2D rlGetTextureDefault(void)
{
    Texture2D texture = { 0 };
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    texture.id = RLGL.State.defaultTextureId;
    texture.width = 1;
    texture.height = 1;
    texture.mipmaps = 1;
    texture.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
#endif
    return texture;
}